

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O3

int kws_search_step(ps_search_t *search,int frame_idx)

{
  uint uVar1;
  acmod_t *acmod;
  long lVar2;
  undefined8 *puVar3;
  int32 iVar4;
  int iVar5;
  _func_int_ps_search_t_ptr *p_Var6;
  ulong uVar7;
  dict2pid_t *pdVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long *plVar14;
  dict2pid_t *pdVar15;
  long lVar16;
  int local_34;
  
  acmod = search->acmod;
  if (acmod->compallsen == '\0') {
    acmod_clear_active(acmod);
    if (0 < *(int *)&search[1].dict) {
      lVar16 = 0;
      lVar13 = 0;
      do {
        acmod_activate_hmm(search->acmod,(hmm_t *)((long)&(search[1].d2p)->refcount + lVar16));
        lVar13 = lVar13 + 1;
        lVar16 = lVar16 + 0x58;
      } while (lVar13 < *(int *)&search[1].dict);
    }
    for (plVar14 = (long *)search[1].type; plVar14 != (long *)0x0; plVar14 = (long *)plVar14[1]) {
      lVar13 = *plVar14;
      iVar9 = *(int *)(lVar13 + 0x18);
      if (0 < iVar9) {
        lVar12 = 0;
        lVar16 = 0;
        do {
          if (0 < *(int *)(*(long *)(lVar13 + 0x10) + 0x4c + lVar12)) {
            acmod_activate_hmm(search->acmod,(hmm_t *)(*(long *)(lVar13 + 0x10) + lVar12));
            iVar9 = *(int *)(lVar13 + 0x18);
          }
          lVar16 = lVar16 + 1;
          lVar12 = lVar12 + 0x58;
        } while (lVar16 < iVar9);
      }
    }
  }
  p_Var6 = (_func_int_ps_search_t_ptr *)acmod_score(acmod,&local_34);
  (search[1].vt)->finish = p_Var6;
  if (*(int *)&search[1].dict < 1) {
    iVar9 = -0x20000000;
  }
  else {
    iVar9 = -0x20000000;
    lVar13 = 0;
    lVar16 = 0;
    do {
      iVar4 = hmm_vit_eval((hmm_t *)((long)&(search[1].d2p)->refcount + lVar13));
      if (iVar9 < iVar4) {
        iVar9 = iVar4;
      }
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0x58;
    } while (lVar16 < *(int *)&search[1].dict);
  }
  plVar14 = (long *)search[1].type;
  if (plVar14 == (long *)0x0) {
    *(int *)((long)&search[1].config + 4) = iVar9;
  }
  else {
    do {
      lVar13 = *plVar14;
      iVar11 = *(int *)(lVar13 + 0x18);
      if (0 < iVar11) {
        lVar16 = 0;
        lVar12 = 0;
        do {
          if (0 < *(int *)(*(long *)(lVar13 + 0x10) + 0x4c + lVar16)) {
            iVar4 = hmm_vit_eval((hmm_t *)(*(long *)(lVar13 + 0x10) + lVar16));
            if (iVar9 < iVar4) {
              iVar9 = iVar4;
            }
            iVar11 = *(int *)(lVar13 + 0x18);
          }
          lVar12 = lVar12 + 1;
          lVar16 = lVar16 + 0x58;
        } while (lVar12 < iVar11);
      }
      plVar14 = (long *)plVar14[1];
    } while (plVar14 != (long *)0x0);
    plVar14 = (long *)search[1].type;
    *(int *)((long)&search[1].config + 4) = iVar9;
    if (plVar14 != (long *)0x0) {
      iVar11 = *(int *)((long)&search[1].pls + 4);
      do {
        lVar13 = *plVar14;
        iVar5 = *(int *)(lVar13 + 0x18);
        if (0 < iVar5) {
          lVar16 = 0;
          lVar12 = 0;
          do {
            lVar2 = *(long *)(lVar13 + 0x10);
            if ((0 < *(int *)(lVar2 + 0x4c + lVar16)) &&
               (*(int *)(lVar2 + 0x44 + lVar16) < iVar9 + iVar11)) {
              hmm_clear((hmm_t *)(lVar2 + lVar16));
              iVar5 = *(int *)(lVar13 + 0x18);
            }
            lVar12 = lVar12 + 1;
            lVar16 = lVar16 + 0x58;
          } while (lVar12 < iVar5);
        }
        plVar14 = (long *)plVar14[1];
      } while (plVar14 != (long *)0x0);
    }
  }
  uVar7 = (ulong)*(int *)&search[1].dict;
  if (0 < (long)uVar7) {
    pdVar8 = search[1].d2p;
    iVar9 = -0x20000000;
    pdVar15 = (dict2pid_t *)0x0;
    uVar10 = uVar7;
    do {
      if (iVar9 < *(int *)&pdVar8->lrssid) {
        pdVar15 = pdVar8;
        iVar9 = *(int *)&pdVar8->lrssid;
      }
      pdVar8 = (dict2pid_t *)&pdVar8[1].rssid;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    if (pdVar15 != (dict2pid_t *)0x0) {
      plVar14 = (long *)search[1].type;
      if (plVar14 != (long *)0x0) {
        do {
          puVar3 = (undefined8 *)*plVar14;
          if (0 < (long)*(int *)(puVar3 + 3)) {
            lVar13 = (long)*(int *)(puVar3 + 3) * 0x58;
            if ((0 < *(int *)(puVar3[2] + -0xc + lVar13)) &&
               (-0x20000000 < *(int *)&pdVar15->lrssid)) {
              lVar13 = puVar3[2] + lVar13;
              iVar9 = *(int *)(lVar13 + -0x28);
              iVar11 = iVar9 - *(int *)&pdVar15->lrssid;
              if (*(int *)(puVar3 + 1) <= iVar11) {
                kws_detections_add((kws_detections_t *)search[1].name,(char *)*puVar3,
                                   *(int *)(lVar13 + -0x24),*(int *)&search[1].pls,iVar11 + -0x5dc,
                                   iVar9);
              }
            }
          }
          plVar14 = (long *)plVar14[1];
        } while (plVar14 != (long *)0x0);
        uVar7 = (ulong)*(uint *)&search[1].dict;
      }
      if (0 < (int)uVar7) {
        lVar16 = 0;
        lVar13 = 0;
        do {
          iVar9 = *(int *)&search[1].config + *(int *)&pdVar15->lrssid;
          if (*(int *)((long)&(search[1].d2p)->mdef + lVar16) < iVar9) {
            hmm_enter((hmm_t *)((long)&(search[1].d2p)->refcount + lVar16),iVar9,
                      *(int32 *)((long)&pdVar15->lrssid + 4),*(int *)&search[1].pls + 1);
            uVar7 = (ulong)*(uint *)&search[1].dict;
          }
          lVar13 = lVar13 + 1;
          lVar16 = lVar16 + 0x58;
        } while (lVar13 < (int)uVar7);
      }
      for (plVar14 = (long *)search[1].type; plVar14 != (long *)0x0; plVar14 = (long *)plVar14[1]) {
        lVar13 = *plVar14;
        uVar1 = *(uint *)(lVar13 + 0x18);
        if (0 < (int)uVar1) {
          if (uVar1 != 1) {
            uVar7 = (ulong)uVar1 + 1;
            lVar16 = (ulong)uVar1 * 0x58 + -0x80;
            do {
              lVar12 = *(long *)(lVar13 + 0x10);
              if ((0 < *(int *)(lVar12 + 0x1c + lVar16)) &&
                 ((*(int *)(lVar12 + 0x74 + lVar16) < 1 ||
                  (*(int *)(lVar12 + 0x30 + lVar16) < *(int32 *)(lVar12 + lVar16))))) {
                hmm_enter((hmm_t *)(lVar12 + lVar16 + 0x28),*(int32 *)(lVar12 + lVar16),
                          *(int32 *)(lVar12 + lVar16 + 4),*(int *)&search[1].pls + 1);
              }
              uVar7 = uVar7 - 1;
              lVar16 = lVar16 + -0x58;
            } while (2 < uVar7);
          }
          if ((*(hmm_t **)(lVar13 + 0x10))->score[0] < *(int32 *)&pdVar15->lrssid) {
            hmm_enter(*(hmm_t **)(lVar13 + 0x10),*(int32 *)&pdVar15->lrssid,*(int *)&search[1].pls,
                      *(int *)&search[1].pls + 1);
          }
        }
      }
    }
  }
  *(int *)&search[1].pls = *(int *)&search[1].pls + 1;
  return 0;
}

Assistant:

int
kws_search_step(ps_search_t * search, int frame_idx)
{
    int16 const *senscr;
    kws_search_t *kwss = (kws_search_t *) search;
    acmod_t *acmod = search->acmod;

    /* Activate senones */
    if (!acmod->compallsen)
        kws_search_sen_active(kwss);

    /* Calculate senone scores for current frame. */
    senscr = acmod_score(acmod, &frame_idx);

    /* Evaluate hmms in phone loop and in active keyphrase nodes */
    kws_search_hmm_eval(kwss, senscr);

    /* Prune hmms with low prob */
    kws_search_hmm_prune(kwss);

    /* Do hmms transitions */
    kws_search_trans(kwss);

    ++kwss->frame;
    return 0;
}